

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitStream.cc
# Opt level: O3

void __thiscall BitStream::reset(BitStream *this)

{
  runtime_error *this_00;
  ulong i;
  
  i = this->nbytes;
  this->p = this->start;
  this->bit_offset = 7;
  if (i >> 0x20 != 0) {
    QIntC::IntConverter<unsigned_long,_unsigned_int,_false,_false>::error(i);
    i = this->nbytes;
  }
  if ((i & 0xe0000000) == 0) {
    this->bits_available = i << 3;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"array too large for bitstream");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
BitStream::reset()
{
    p = start;
    bit_offset = 7;
    if (QIntC::to_uint(nbytes) > static_cast<unsigned int>(-1) / 8) {
        throw std::runtime_error("array too large for bitstream");
    }
    bits_available = 8 * nbytes;
}